

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_0::formatProperties
          (TestStatus *__return_storage_ptr__,Context *context,VkFormat format)

{
  ostringstream *this;
  TestLog *pTVar1;
  char *__s;
  bool bVar2;
  InstanceInterface *vk;
  VkPhysicalDevice physicalDevice;
  VkFormat *pVVar3;
  wchar_t *pwVar4;
  size_t sVar5;
  uint uVar6;
  ulong uVar7;
  undefined1 *puVar8;
  long lVar9;
  uint uVar10;
  anon_struct_24_3_8eb95548 fields [3];
  VkFormatProperties local_258;
  Bitfield<32UL> local_248;
  undefined8 uStack_230;
  uint local_228 [2];
  char *local_220;
  undefined4 local_218;
  undefined8 local_210;
  char *local_208;
  uint local_200;
  undefined8 local_1f8;
  char *local_1f0;
  uint local_1e8;
  Bitfield<32UL> local_1e0;
  Bitfield<32UL> local_1c8;
  undefined1 local_1b0 [16];
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  
  pTVar1 = context->m_testCtx->m_log;
  vk = Context::getInstanceInterface(context);
  physicalDevice = Context::getPhysicalDevice(context);
  local_258 = ::vk::getPhysicalDeviceFormatProperties(vk,physicalDevice,format);
  local_228[0] = 0;
  local_228[1] = 0;
  local_220 = "linearTilingFeatures";
  local_218 = 0;
  local_210 = 4;
  local_208 = "optimalTilingFeatures";
  local_1b0._0_4_ = format;
  pVVar3 = std::
           __find_if<vk::VkFormat_const*,__gnu_cxx::__ops::_Iter_equals_val<vk::VkFormat_const>>
                     (api::(anonymous_namespace)::getRequiredOptimalTilingFeatures(vk::VkFormat)::
                      s_requiredSampledImageBlitSrcFormats,&DAT_00aff93c,local_1b0);
  uVar6 = 0x401;
  if (pVVar3 == (VkFormat *)&DAT_00aff93c) {
    uVar6 = 0;
  }
  uVar7 = 6;
  pVVar3 = &DAT_00aff948;
  do {
    if (pVVar3[-2] == local_1b0._0_4_) {
      pVVar3 = pVVar3 + -2;
      goto LAB_0044e2d3;
    }
    if (pVVar3[-1] == local_1b0._0_4_) {
      pVVar3 = pVVar3 + -1;
      goto LAB_0044e2d3;
    }
    if (*pVVar3 == local_1b0._0_4_) goto LAB_0044e2d3;
    if (pVVar3[1] == local_1b0._0_4_) {
      pVVar3 = pVVar3 + 1;
      goto LAB_0044e2d3;
    }
    uVar7 = uVar7 - 1;
    pVVar3 = pVVar3 + 4;
  } while (1 < uVar7);
  pVVar3 = (VkFormat *)
           (&UNK_00aff990 + (ulong)(local_1b0._0_4_ != VK_FORMAT_E5B9G9R9_UFLOAT_PACK32) * 4);
LAB_0044e2d3:
  uVar10 = uVar6 + 0x1000;
  if (pVVar3 == (VkFormat *)&DAT_00aff994) {
    uVar10 = uVar6;
  }
  uVar7 = 5;
  puVar8 = (undefined1 *)&DAT_00aff9a8;
  do {
    if (*(VkFormat *)((long)puVar8 + -8) == local_1b0._0_4_) {
      puVar8 = (undefined1 *)((long)puVar8 + -8);
      goto LAB_0044e332;
    }
    if (*(VkFormat *)((long)puVar8 + -4) == local_1b0._0_4_) {
      puVar8 = (undefined1 *)((long)puVar8 + -4);
      goto LAB_0044e332;
    }
    if (*(VkFormat *)puVar8 == local_1b0._0_4_) goto LAB_0044e332;
    if (*(VkFormat *)((long)puVar8 + 4) == local_1b0._0_4_) {
      puVar8 = (undefined1 *)((long)puVar8 + 4);
      goto LAB_0044e332;
    }
    uVar7 = uVar7 - 1;
    puVar8 = (undefined1 *)((long)puVar8 + 0x10);
  } while (1 < uVar7);
  puVar8 = api::(anonymous_namespace)::getRequiredOptimalTilingFeatures(vk::VkFormat)::
           s_requiredColorAttachmentBlitDstFormats;
LAB_0044e332:
  uVar6 = uVar10 | 2;
  if (puVar8 == api::(anonymous_namespace)::getRequiredOptimalTilingFeatures(vk::VkFormat)::
                s_requiredColorAttachmentBlitDstFormats) {
    uVar6 = uVar10;
  }
  uVar10 = uVar6 | 4;
  if (local_1b0._0_4_ - VK_FORMAT_R32_SFLOAT < 0xfffffffe) {
    uVar10 = uVar6;
  }
  pVVar3 = std::
           __find_if<vk::VkFormat_const*,__gnu_cxx::__ops::_Iter_equals_val<vk::VkFormat_const>>
                     (api::(anonymous_namespace)::getRequiredOptimalTilingFeatures(vk::VkFormat)::
                      s_requiredColorAttachmentBlitDstFormats,&DAT_00affa78,local_1b0);
  uVar6 = uVar10 | 0x880;
  if (pVVar3 == (VkFormat *)&DAT_00affa78) {
    uVar6 = uVar10;
  }
  pVVar3 = std::
           __find_if<vk::VkFormat_const*,__gnu_cxx::__ops::_Iter_equals_val<vk::VkFormat_const>>
                     (api::(anonymous_namespace)::getRequiredOptimalTilingFeatures(vk::VkFormat)::
                      s_requiredColorAttachmentBlendFormats,&DAT_00affab8,local_1b0);
  uVar10 = uVar6 | 0x100;
  if (pVVar3 == (VkFormat *)&DAT_00affab8) {
    uVar10 = uVar6;
  }
  local_200 = uVar10 | 0x200;
  if (local_1b0._0_4_ != VK_FORMAT_D16_UNORM) {
    local_200 = uVar10;
  }
  local_1f8 = 8;
  local_1f0 = "buffeFeatures";
  local_1b0._0_4_ = format;
  uVar7 = 0xc;
  pwVar4 = L"\r\x0e\x10\x11\x14\x15%&)*,3478@FGJKLMNQRS[\\_`abcdefghijklm";
  do {
    if (pwVar4[-2] == format) {
      pwVar4 = pwVar4 + -2;
      goto LAB_0044e428;
    }
    if (pwVar4[-1] == format) {
      pwVar4 = pwVar4 + -1;
      goto LAB_0044e428;
    }
    if (*pwVar4 == format) goto LAB_0044e428;
    if (pwVar4[1] == format) {
      pwVar4 = pwVar4 + 1;
      goto LAB_0044e428;
    }
    uVar7 = uVar7 - 1;
    pwVar4 = pwVar4 + 4;
  } while (1 < uVar7);
  pwVar4 = L"%&)*,3478@FGJKLMNQRS[\\_`abcdefghijklm" +
           (ulong)(format != VK_FORMAT_R32G32B32A32_SFLOAT) + 0x24;
LAB_0044e428:
  uVar10 = (uint)(pwVar4 != L"") * 0x40;
  pVVar3 = std::
           __find_if<vk::VkFormat_const*,__gnu_cxx::__ops::_Iter_equals_val<vk::VkFormat_const>>
                     (api::(anonymous_namespace)::getRequiredBufferFeatures(vk::VkFormat)::
                      s_requiredUniformTexelBufferFormats,&DAT_00affc18,local_1b0);
  uVar6 = uVar10 + 8;
  if (pVVar3 == (VkFormat *)&DAT_00affc18) {
    uVar6 = uVar10;
  }
  uVar7 = 6;
  pVVar3 = &DAT_00affc28;
  do {
    if (pVVar3[-2] == local_1b0._0_4_) {
      pVVar3 = pVVar3 + -2;
      goto LAB_0044e4b4;
    }
    if (pVVar3[-1] == local_1b0._0_4_) {
      pVVar3 = pVVar3 + -1;
      goto LAB_0044e4b4;
    }
    if (*pVVar3 == local_1b0._0_4_) goto LAB_0044e4b4;
    if (pVVar3[1] == local_1b0._0_4_) {
      pVVar3 = pVVar3 + 1;
      goto LAB_0044e4b4;
    }
    uVar7 = uVar7 - 1;
    pVVar3 = pVVar3 + 4;
  } while (1 < uVar7);
  pVVar3 = testCompressedFormatsSupported::s_allBcFormats;
LAB_0044e4b4:
  uVar10 = uVar6 | 0x10;
  if (pVVar3 == testCompressedFormatsSupported::s_allBcFormats) {
    uVar10 = uVar6;
  }
  local_1e8 = uVar10 | 0x20;
  if (local_1b0._0_4_ - VK_FORMAT_R32_SFLOAT < 0xfffffffe) {
    local_1e8 = uVar10;
  }
  this = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar1;
  std::__cxx11::ostringstream::ostringstream(this);
  ::vk::operator<<((ostream *)this,&local_258);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this);
  std::ios_base::~ios_base(local_138);
  bVar2 = true;
  lVar9 = 0x10;
  do {
    uVar6 = *(uint *)((long)local_228 + lVar9);
    uVar10 = ~*(uint *)((long)&local_258.linearTilingFeatures +
                       *(long *)((long)&local_248.m_end + lVar9));
    if ((uVar6 & uVar10) != 0) {
      __s = *(char **)((long)&uStack_230 + lVar9);
      local_1b0._0_8_ = pTVar1;
      std::__cxx11::ostringstream::ostringstream(this);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"ERROR in ",9);
      if (__s == (char *)0x0) {
        std::ios::clear((int)this + (int)*(undefined8 *)(local_1b0._8_8_ + -0x18));
      }
      else {
        sVar5 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,__s,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,":\n",2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"  required: ",0xc);
      ::vk::getFormatFeatureFlagsStr(&local_1c8,uVar6);
      local_248.m_end = local_1c8.m_end;
      local_248.m_value = local_1c8.m_value;
      local_248.m_begin = local_1c8.m_begin;
      tcu::Format::Bitfield<32UL>::toStream(&local_248,(ostream *)this);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"\n  ",3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"  missing: ",0xb);
      ::vk::getFormatFeatureFlagsStr(&local_1e0,uVar6 & uVar10);
      local_248.m_end = local_1e0.m_end;
      local_248.m_value = local_1e0.m_value;
      local_248.m_begin = local_1e0.m_begin;
      tcu::Format::Bitfield<32UL>::toStream(&local_248,(ostream *)this);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this);
      std::ios_base::~ios_base(local_138);
      bVar2 = false;
    }
    lVar9 = lVar9 + 0x18;
  } while (lVar9 != 0x58);
  local_1b0._0_8_ = local_1a0;
  if (bVar2) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"Query and validation passed","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_1b0._0_8_,
               (long)(qpTestLog **)local_1b0._0_8_ + local_1b0._8_8_);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"Required features not supported","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_1b0._0_8_,
               (long)(qpTestLog **)local_1b0._0_8_ + local_1b0._8_8_);
  }
  if ((TestLog *)local_1b0._0_8_ != local_1a0) {
    operator_delete((void *)local_1b0._0_8_,(ulong)((long)&(local_1a0[0].m_log)->flags + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus formatProperties (Context& context, VkFormat format)
{
	TestLog&					log				= context.getTestContext().getLog();
	const VkFormatProperties	properties		= getPhysicalDeviceFormatProperties(context.getInstanceInterface(), context.getPhysicalDevice(), format);
	bool						allOk			= true;

	const struct
	{
		VkFormatFeatureFlags VkFormatProperties::*	field;
		const char*									fieldName;
		VkFormatFeatureFlags						requiredFeatures;
	} fields[] =
	{
		{ &VkFormatProperties::linearTilingFeatures,	"linearTilingFeatures",		(VkFormatFeatureFlags)0						},
		{ &VkFormatProperties::optimalTilingFeatures,	"optimalTilingFeatures",	getRequiredOptimalTilingFeatures(format)	},
		{ &VkFormatProperties::bufferFeatures,			"buffeFeatures",			getRequiredBufferFeatures(format)			}
	};

	log << TestLog::Message << properties << TestLog::EndMessage;

	for (int fieldNdx = 0; fieldNdx < DE_LENGTH_OF_ARRAY(fields); fieldNdx++)
	{
		const char* const				fieldName	= fields[fieldNdx].fieldName;
		const VkFormatFeatureFlags		supported	= properties.*fields[fieldNdx].field;
		const VkFormatFeatureFlags		required	= fields[fieldNdx].requiredFeatures;

		if ((supported & required) != required)
		{
			log << TestLog::Message << "ERROR in " << fieldName << ":\n"
								    << "  required: " << getFormatFeatureFlagsStr(required) << "\n  "
									<< "  missing: " << getFormatFeatureFlagsStr(~supported & required)
				<< TestLog::EndMessage;
			allOk = false;
		}
	}

	if (allOk)
		return tcu::TestStatus::pass("Query and validation passed");
	else
		return tcu::TestStatus::fail("Required features not supported");
}